

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

Path * __thiscall
tinyusdz::Path::AppendElement(Path *__return_storage_ptr__,Path *this,string *elem)

{
  Path PStack_e8;
  
  Path(__return_storage_ptr__,this);
  append_element(&PStack_e8,__return_storage_ptr__,elem);
  ~Path(&PStack_e8);
  return __return_storage_ptr__;
}

Assistant:

const Path Path::AppendElement(const std::string &elem) const {
  Path p = (*this);  // copies

  p.append_element(elem);

  return p;
}